

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qimage.cpp
# Opt level: O3

void __thiscall QImage::applyColorTransform(QImage *this,QColorTransform *transform)

{
  Format f;
  QColorTransformPrivate *pQVar1;
  QColorSpacePrivate *pQVar2;
  bool bVar3;
  char cVar4;
  QRgb QVar5;
  QPixelFormat format;
  pointer puVar6;
  QThreadPool *pQVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  uint uVar10;
  int iVar11;
  ColorModel CVar12;
  Format FVar13;
  ColorModel CVar14;
  QImageData *pQVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  long in_FS_OFFSET;
  QSemaphore semaphore;
  QImage local_a0;
  undefined8 *local_88;
  undefined8 uStack_80;
  code *local_78;
  code *pcStack_70;
  undefined1 local_5c [4];
  anon_class_24_3_f0e105ae local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = QColorTransform::isIdentity(transform);
  if (bVar3) goto LAB_0028cab3;
  pQVar15 = this->d;
  if (pQVar15 == (QImageData *)0x0) {
    uVar18 = 0;
  }
  else {
    uVar18 = (ulong)pQVar15->format;
  }
  uVar10 = (uint)pixelformats[uVar18].data & 0xf;
  if (uVar10 < 9) {
    pQVar1 = (transform->d).d.ptr;
    CVar12 = ((pQVar1->colorSpaceIn).d.ptr)->colorModel;
    CVar14 = Rgb;
    switch(uVar10) {
    case 3:
      CVar14 = Gray;
      break;
    case 4:
      CVar14 = Cmyk;
      break;
    case 5:
    case 6:
    case 7:
      goto switchD_0028c65b_caseD_5;
    case 8:
      goto switchD_0028c65b_caseD_8;
    }
    if ((CVar14 != CVar12) && ((uVar10 != 3 || (CVar12 != Rgb)))) goto switchD_0028c65b_caseD_5;
switchD_0028c65b_caseD_8:
    if (pQVar15 == (QImageData *)0x0) {
      uVar18 = 0;
    }
    else {
      uVar18 = (ulong)pQVar15->format;
    }
    uVar10 = (uint)pixelformats[uVar18].data & 0xf;
    if (8 < uVar10) goto switchD_0028c65b_caseD_5;
    pQVar2 = (pQVar1->colorSpaceOut).d.ptr;
    CVar12 = Rgb;
    switch(uVar10) {
    case 3:
      CVar12 = Gray;
      break;
    case 4:
      CVar12 = Cmyk;
      break;
    case 5:
    case 6:
    case 7:
      goto switchD_0028c65b_caseD_5;
    case 8:
      goto switchD_0028c6b6_caseD_8;
    }
    if ((CVar12 == pQVar2->colorModel) ||
       ((uVar10 == 3 && (pQVar2->transformModel == ThreeComponentMatrix)))) {
switchD_0028c6b6_caseD_8:
      detach(this);
      pQVar15 = this->d;
      if (pQVar15 == (QImageData *)0x0) goto LAB_0028cab3;
      f = pQVar15->format;
      if (((uint)pixelformats[f].data & 0xf) == 2) {
        if ((pQVar15->colortable).d.size != 0) {
          uVar18 = 0;
          do {
            puVar6 = QList<unsigned_int>::data(&pQVar15->colortable);
            QVar5 = QColorTransform::map(transform,puVar6[uVar18]);
            puVar6 = QList<unsigned_int>::data(&this->d->colortable);
            puVar6[uVar18] = QVar5;
            uVar18 = uVar18 + 1;
            pQVar15 = this->d;
          } while (uVar18 < (ulong)(pQVar15->colortable).d.size);
        }
        goto LAB_0028cab3;
      }
      if (f - Format_RGBX16FPx4 < 6) {
        FVar13 = Format_RGBA32FPx4;
        if (f < Format_RGBX32FPx4) goto LAB_0028c79b;
      }
      else if (pQVar15->depth < 0x21) {
        if ((Format_CMYK8888 < f) || ((0x1011000070U >> ((ulong)f & 0x3f) & 1) == 0)) {
          FVar13 = Format_ARGB32 - ((pixelformats[f].data >> 0x28 & 1) != 0);
          goto LAB_0028c79b;
        }
      }
      else {
        FVar13 = Format_RGBA64;
        if (f - Format_Grayscale16 < 0xfffffffd) {
LAB_0028c79b:
          convertTo(this,FVar13,(ImageConversionFlags)0x0);
        }
      }
      local_5c = (undefined1  [4])0x0;
      FVar13 = this->d->format;
      if ((0x1213000010U >> ((ulong)FVar13 & 0x3f) & 1) == 0) {
        if ((0x404000020U >> ((ulong)FVar13 & 0x3f) & 1) == 0) {
          local_5c = (undefined1  [4])0x6;
        }
      }
      else {
        local_5c = (undefined1  [4])0x1;
      }
      local_78 = (code *)0x0;
      pcStack_70 = (code *)0x0;
      local_88 = (undefined8 *)0x0;
      uStack_80 = 0;
      if (FVar13 == Format_Grayscale16) {
        local_88 = (undefined8 *)operator_new(0x18);
        *local_88 = this;
        local_88[1] = transform;
        local_88[2] = local_5c;
        local_78 = std::
                   _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/image/qimage.cpp:5304:28)>
                   ::_M_manager;
        pcStack_70 = std::
                     _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/image/qimage.cpp:5304:28)>
                     ::_M_invoke;
LAB_0028c879:
        uStack_80 = 0;
      }
      else {
        if (FVar13 == Format_Grayscale8) {
          local_88 = (undefined8 *)operator_new(0x18);
          *local_88 = this;
          local_88[1] = transform;
          local_88[2] = local_5c;
          local_78 = std::
                     _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/image/qimage.cpp:5297:28)>
                     ::_M_manager;
          pcStack_70 = std::
                       _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/image/qimage.cpp:5297:28)>
                       ::_M_invoke;
          goto LAB_0028c879;
        }
        local_58.this = this;
        local_58.transform = transform;
        if (FVar13 - Format_RGBX16FPx4 < 6) {
          local_58.flags = (TransformFlags *)local_5c;
          std::function<void(int,int)>::operator=((function<void(int,int)> *)&local_88,&local_58);
        }
        else if (this->d->depth < 0x21) {
          if (f == Format_CMYK8888) {
            local_58.flags = (TransformFlags *)local_5c;
            std::function<void(int,int)>::operator=((function<void(int,int)> *)&local_88,&local_58);
          }
          else {
            local_58.flags = (TransformFlags *)local_5c;
            std::function<void(int,int)>::operator=((function<void(int,int)> *)&local_88,&local_58);
          }
        }
        else {
          local_58.flags = (TransformFlags *)local_5c;
          std::function<void(int,int)>::operator=((function<void(int,int)> *)&local_88,&local_58);
        }
      }
      pQVar15 = this->d;
      if (pQVar15 == (QImageData *)0x0) {
        iVar16 = 0;
        iVar17 = 0;
      }
      else {
        iVar17 = pQVar15->height;
        iVar16 = (int)((ulong)((long)pQVar15->width * (long)iVar17) >> 0x10);
      }
      if (iVar17 < iVar16) {
        iVar16 = iVar17;
      }
      pQVar7 = QGuiApplicationPrivate::qtGuiThreadPool();
      if (pQVar7 == (QThreadPool *)0x0 || iVar16 < 2) {
LAB_0028c8d2:
        if (this->d == (QImageData *)0x0) {
          local_a0.super_QPaintDevice._vptr_QPaintDevice._0_4_ = 0;
        }
        else {
          local_a0.super_QPaintDevice._vptr_QPaintDevice._0_4_ = this->d->height;
        }
        local_58.this = (QImage *)((ulong)local_58.this & 0xffffffff00000000);
        if (local_78 == (code *)0x0) {
          std::__throw_bad_function_call();
        }
        (*pcStack_70)(&local_88,&local_58,&local_a0);
      }
      else {
        QThread::currentThread();
        cVar4 = QThreadPool::contains((QThread *)pQVar7);
        if (cVar4 != '\0') goto LAB_0028c8d2;
        local_58.this = (QImage *)&DAT_aaaaaaaaaaaaaaaa;
        iVar17 = 0;
        QSemaphore::QSemaphore((QSemaphore *)&local_58,0);
        do {
          iVar11 = 0;
          if (this->d != (QImageData *)0x0) {
            iVar11 = this->d->height;
          }
          iVar11 = (iVar11 - iVar17) / iVar16;
          puVar8 = (undefined8 *)operator_new(0x18);
          *(undefined1 *)(puVar8 + 1) = 1;
          *puVar8 = QFactoryLoader::keyMap;
          puVar9 = (undefined8 *)operator_new(0x20);
          *puVar9 = QRunnable::QGenericRunnable::
                    Helper<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/image/qimage.cpp:5349:31)>
                    ::impl;
          *(int *)(puVar9 + 1) = iVar17;
          *(int *)((long)puVar9 + 0xc) = iVar11;
          puVar9[2] = &local_88;
          puVar9[3] = &local_58;
          puVar8[2] = puVar9;
          QThreadPool::start((QRunnable *)pQVar7,(int)puVar8);
          iVar17 = iVar17 + iVar11;
          iVar16 = iVar16 + -1;
        } while (iVar16 != 0);
        QSemaphore::acquire((int)&local_58);
        QSemaphore::~QSemaphore((QSemaphore *)&local_58);
      }
      if (this->d == (QImageData *)0x0) {
        FVar13 = Format_Invalid;
      }
      else {
        FVar13 = this->d->format;
      }
      if (f != FVar13) {
        convertToFormat(&local_a0,this,f,(ImageConversionFlags)0x0);
        local_58.flags = (TransformFlags *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.this = (QImage *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.transform = (QColorTransform *)&DAT_aaaaaaaaaaaaaaaa;
        QPaintDevice::QPaintDevice((QPaintDevice *)&local_58);
        pQVar15 = local_a0.d;
        local_58.this = (QImage *)&PTR__QImage_007d1ec8;
        local_a0.d = (QImageData *)0x0;
        local_58.flags = (TransformFlags *)this->d;
        this->d = pQVar15;
        ~QImage((QImage *)&local_58);
        ~QImage(&local_a0);
      }
      if (local_78 != (code *)0x0) {
        (*local_78)(&local_88,&local_88,3);
      }
      goto LAB_0028cab3;
    }
  }
switchD_0028c65b_caseD_5:
  applyColorTransform();
LAB_0028cab3:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QImage::applyColorTransform(const QColorTransform &transform)
{
    if (transform.isIdentity())
        return;

    if (!qt_compatibleColorModelSource(pixelFormat().colorModel(), QColorTransformPrivate::get(transform)->colorSpaceIn->colorModel) ||
        !qt_compatibleColorModelTarget(pixelFormat().colorModel(), QColorTransformPrivate::get(transform)->colorSpaceOut->colorModel,
                                       QColorTransformPrivate::get(transform)->colorSpaceOut->transformModel)) {
        qWarning() << "QImage::applyColorTransform can not apply format switching transform without switching format";
        return;
    }

    detach();
    if (!d)
        return;
    if (pixelFormat().colorModel() == QPixelFormat::Indexed) {
        for (int i = 0; i < d->colortable.size(); ++i)
            d->colortable[i] = transform.map(d->colortable[i]);
        return;
    }
    QImage::Format oldFormat = format();
    if (qt_fpColorPrecision(oldFormat)) {
        if (oldFormat != QImage::Format_RGBX32FPx4 && oldFormat != QImage::Format_RGBA32FPx4
                && oldFormat != QImage::Format_RGBA32FPx4_Premultiplied)
            convertTo(QImage::Format_RGBA32FPx4);
    } else if (depth() > 32) {
        if (oldFormat != QImage::Format_RGBX64 && oldFormat != QImage::Format_RGBA64
                && oldFormat != QImage::Format_RGBA64_Premultiplied)
            convertTo(QImage::Format_RGBA64);
    } else if (oldFormat != QImage::Format_ARGB32 && oldFormat != QImage::Format_RGB32
                && oldFormat != QImage::Format_ARGB32_Premultiplied && oldFormat != QImage::Format_CMYK8888
                && oldFormat != QImage::Format_Grayscale8 && oldFormat != QImage::Format_Grayscale16) {
        if (hasAlphaChannel())
            convertTo(QImage::Format_ARGB32);
        else
            convertTo(QImage::Format_RGB32);
    }

    QColorTransformPrivate::TransformFlags flags = QColorTransformPrivate::Unpremultiplied;
    switch (format()) {
    case Format_ARGB32_Premultiplied:
    case Format_RGBA64_Premultiplied:
    case Format_RGBA32FPx4_Premultiplied:
        flags = QColorTransformPrivate::Premultiplied;
        break;
    case Format_Grayscale8:
    case Format_Grayscale16:
    case Format_RGB32:
    case Format_CMYK8888:
    case Format_RGBX64:
    case Format_RGBX32FPx4:
        flags = QColorTransformPrivate::InputOpaque;
        break;
    case Format_ARGB32:
    case Format_RGBA64:
    case Format_RGBA32FPx4:
        break;
    default:
        Q_UNREACHABLE();
    }

    std::function<void(int,int)> transformSegment;

    if (format() == Format_Grayscale8) {
        transformSegment = [&](int yStart, int yEnd) {
            for (int y = yStart; y < yEnd; ++y) {
                uint8_t *scanline = reinterpret_cast<uint8_t *>(d->data + y * d->bytes_per_line);
                QColorTransformPrivate::get(transform)->apply(scanline, scanline, width(), flags);
            }
        };
    } else if (format() == Format_Grayscale16) {
        transformSegment = [&](int yStart, int yEnd) {
            for (int y = yStart; y < yEnd; ++y) {
                uint16_t *scanline = reinterpret_cast<uint16_t *>(d->data + y * d->bytes_per_line);
                QColorTransformPrivate::get(transform)->apply(scanline, scanline, width(), flags);
            }
        };
    } else if (qt_fpColorPrecision(format())) {
        transformSegment = [&](int yStart, int yEnd) {
            for (int y = yStart; y < yEnd; ++y) {
                QRgbaFloat32 *scanline = reinterpret_cast<QRgbaFloat32 *>(d->data + y * d->bytes_per_line);
                QColorTransformPrivate::get(transform)->apply(scanline, scanline, width(), flags);
            }
        };
    } else  if (depth() > 32) {
        transformSegment = [&](int yStart, int yEnd) {
            for (int y = yStart; y < yEnd; ++y) {
                QRgba64 *scanline = reinterpret_cast<QRgba64 *>(d->data + y * d->bytes_per_line);
                QColorTransformPrivate::get(transform)->apply(scanline, scanline, width(), flags);
            }
        };
    } else if (oldFormat == QImage::Format_CMYK8888) {
        transformSegment = [&](int yStart, int yEnd) {
            for (int y = yStart; y < yEnd; ++y) {
                QCmyk32 *scanline = reinterpret_cast<QCmyk32 *>(d->data + y * d->bytes_per_line);
                QColorTransformPrivate::get(transform)->apply(scanline, scanline, width(), flags);
            }
        };
    } else {
        transformSegment = [&](int yStart, int yEnd) {
            for (int y = yStart; y < yEnd; ++y) {
                QRgb *scanline = reinterpret_cast<QRgb *>(d->data + y * d->bytes_per_line);
                QColorTransformPrivate::get(transform)->apply(scanline, scanline, width(), flags);
            }
        };
    }

#if QT_CONFIG(qtgui_threadpool)
    int segments = (qsizetype(width()) * height()) >> 16;
    segments = std::min(segments, height());
    QThreadPool *threadPool = QGuiApplicationPrivate::qtGuiThreadPool();
    if (segments > 1 && threadPool && !threadPool->contains(QThread::currentThread())) {
        QSemaphore semaphore;
        int y = 0;
        for (int i = 0; i < segments; ++i) {
            int yn = (height() - y) / (segments - i);
            threadPool->start([&, y, yn]() {
                transformSegment(y, y + yn);
                semaphore.release(1);
            });
            y += yn;
        }
        semaphore.acquire(segments);
    } else
#endif
        transformSegment(0, height());

    if (oldFormat != format())
        *this = std::move(*this).convertToFormat(oldFormat);
}